

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_solvers.h
# Opt level: O0

void __thiscall
Solver::Solver(Solver *this,SolverFn *solver_fn,uint32_t configuration,string *name,string *desc,
              uint32_t features)

{
  string *in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  string *in_R8;
  uint in_R9D;
  
  *in_RDI = in_RSI;
  *(undefined4 *)(in_RDI + 1) = in_EDX;
  std::__cxx11::string::string((string *)(in_RDI + 2),in_RCX);
  std::__cxx11::string::string((string *)(in_RDI + 6),in_R8);
  *(bool *)(in_RDI + 10) = (in_R9D & 1) != 0;
  *(bool *)((long)in_RDI + 0x51) = (in_R9D & 2) != 0;
  *(bool *)((long)in_RDI + 0x52) = (in_R9D & 4) != 0;
  *(bool *)((long)in_RDI + 0x53) = (in_R9D & 8) != 0;
  return;
}

Assistant:

Solver(SolverFn *solver_fn, uint32_t configuration, std::string name, std::string desc, uint32_t features)
            : solve_(solver_fn), configuration_(configuration), name_(std::move(name)), desc_(std::move(desc)),
              returns_solution_((features & 1u) > 0),
              returns_count_((features & 2u) > 0),
              returns_full_count_((features & 4u) > 0),
              returns_guess_count_((features & 8u) > 0) {}